

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vertexClustering.cpp
# Opt level: O2

bool __thiscall VCIQuad::solveQuadMetric(VCIQuad *this,Matrix4d *E,Vector3d *result)

{
  double *s;
  undefined1 auVar1 [16];
  CommaInitializer<Eigen::Block<Eigen::Matrix<double,_4,_4,_0,_4,_4>,_1,_4,_false>_> *pCVar2;
  CommaInitializer<Eigen::Matrix<double,_4,_1,_0,_4,_1>_> *pCVar3;
  RealScalar RVar4;
  Scalar local_280;
  undefined1 local_278 [48];
  Vector4d b;
  Scalar local_220;
  Vector4d x;
  ColPivHouseholderQR<Eigen::Matrix<double,_4,_4,_0,_4,_4>_> local_1f8;
  Matrix4d E1;
  
  Eigen::internal::BlockImpl_dense<const_Eigen::Matrix<double,_4,_4,_0,_4,_4>,_1,_4,_false,_true>::
  BlockImpl_dense((BlockImpl_dense<const_Eigen::Matrix<double,_4,_4,_0,_4,_4>,_1,_4,_false,_true> *)
                  &local_1f8,E,0);
  Eigen::internal::BlockImpl_dense<Eigen::Matrix<double,_4,_4,_0,_4,_4>,_1,_4,_false,_true>::
  BlockImpl_dense((BlockImpl_dense<Eigen::Matrix<double,_4,_4,_0,_4,_4>,_1,_4,_false,_true> *)
                  local_278,&E1,0);
  *(double *)local_278._0_8_ =
       *(double *)
        local_1f8.m_qr.super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>.m_storage.m_data
        .array[0];
  *(double *)(local_278._0_8_ + 0x20) =
       *(double *)
        ((long)local_1f8.m_qr.super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>.m_storage
               .m_data.array[0] + 0x20);
  *(double *)(local_278._0_8_ + 0x40) =
       *(double *)
        ((long)local_1f8.m_qr.super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>.m_storage
               .m_data.array[0] + 0x40);
  *(double *)(local_278._0_8_ + 0x60) =
       *(double *)
        ((long)local_1f8.m_qr.super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>.m_storage
               .m_data.array[0] + 0x60);
  Eigen::internal::BlockImpl_dense<Eigen::Matrix<double,_4,_4,_0,_4,_4>,_1,_4,_false,_true>::
  BlockImpl_dense((BlockImpl_dense<Eigen::Matrix<double,_4,_4,_0,_4,_4>,_1,_4,_false,_true> *)
                  local_278,&E1,1);
  local_1f8.m_qr.super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>.m_storage.m_data.array
  [1] = 0.0;
  local_1f8.m_qr.super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>.m_storage.m_data.array
  [2] = 4.94065645841247e-324;
  local_1f8.m_qr.super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>.m_storage.m_data.array
  [3] = 4.94065645841247e-324;
  *(double *)local_278._0_8_ =
       (E->super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>).m_storage.m_data.array[4];
  local_1f8.m_qr.super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>.m_storage.m_data.array
  [0] = (double)local_278;
  pCVar2 = Eigen::CommaInitializer<Eigen::Block<Eigen::Matrix<double,_4,_4,_0,_4,_4>,_1,_4,_false>_>
           ::operator_((CommaInitializer<Eigen::Block<Eigen::Matrix<double,_4,_4,_0,_4,_4>,_1,_4,_false>_>
                        *)&local_1f8,
                       (E->super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>).m_storage.
                       m_data.array + 5);
  s = (E->super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>).m_storage.m_data.array + 9;
  pCVar2 = Eigen::CommaInitializer<Eigen::Block<Eigen::Matrix<double,_4,_4,_0,_4,_4>,_1,_4,_false>_>
           ::operator_(pCVar2,s);
  Eigen::CommaInitializer<Eigen::Block<Eigen::Matrix<double,_4,_4,_0,_4,_4>,_1,_4,_false>_>::
  operator_(pCVar2,(E->super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>).m_storage.
                   m_data.array + 0xd);
  Eigen::CommaInitializer<Eigen::Block<Eigen::Matrix<double,_4,_4,_0,_4,_4>,_1,_4,_false>_>::
  finished((CommaInitializer<Eigen::Block<Eigen::Matrix<double,_4,_4,_0,_4,_4>,_1,_4,_false>_> *)
           &local_1f8);
  Eigen::internal::BlockImpl_dense<Eigen::Matrix<double,_4,_4,_0,_4,_4>,_1,_4,_false,_true>::
  BlockImpl_dense((BlockImpl_dense<Eigen::Matrix<double,_4,_4,_0,_4,_4>,_1,_4,_false,_true> *)
                  local_278,&E1,2);
  local_1f8.m_qr.super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>.m_storage.m_data.array
  [1] = 0.0;
  local_1f8.m_qr.super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>.m_storage.m_data.array
  [2] = 4.94065645841247e-324;
  local_1f8.m_qr.super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>.m_storage.m_data.array
  [3] = 4.94065645841247e-324;
  *(double *)local_278._0_8_ =
       (E->super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>).m_storage.m_data.array[8];
  local_1f8.m_qr.super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>.m_storage.m_data.array
  [0] = (double)local_278;
  pCVar2 = Eigen::CommaInitializer<Eigen::Block<Eigen::Matrix<double,_4,_4,_0,_4,_4>,_1,_4,_false>_>
           ::operator_((CommaInitializer<Eigen::Block<Eigen::Matrix<double,_4,_4,_0,_4,_4>,_1,_4,_false>_>
                        *)&local_1f8,s);
  pCVar2 = Eigen::CommaInitializer<Eigen::Block<Eigen::Matrix<double,_4,_4,_0,_4,_4>,_1,_4,_false>_>
           ::operator_(pCVar2,(E->super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>).
                              m_storage.m_data.array + 10);
  Eigen::CommaInitializer<Eigen::Block<Eigen::Matrix<double,_4,_4,_0,_4,_4>,_1,_4,_false>_>::
  operator_(pCVar2,(E->super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>).m_storage.
                   m_data.array + 0xe);
  Eigen::CommaInitializer<Eigen::Block<Eigen::Matrix<double,_4,_4,_0,_4,_4>,_1,_4,_false>_>::
  finished((CommaInitializer<Eigen::Block<Eigen::Matrix<double,_4,_4,_0,_4,_4>,_1,_4,_false>_> *)
           &local_1f8);
  Eigen::internal::BlockImpl_dense<Eigen::Matrix<double,_4,_4,_0,_4,_4>,_1,_4,_false,_true>::
  BlockImpl_dense((BlockImpl_dense<Eigen::Matrix<double,_4,_4,_0,_4,_4>,_1,_4,_false,_true> *)
                  local_278,&E1,3);
  local_1f8.m_qr.super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>.m_storage.m_data.array
  [1] = 0.0;
  local_1f8.m_qr.super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>.m_storage.m_data.array
  [2] = 4.94065645841247e-324;
  local_1f8.m_qr.super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>.m_storage.m_data.array
  [3] = 4.94065645841247e-324;
  *(double *)local_278._0_8_ = 0.0;
  b.super_PlainObjectBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>_>.m_storage.m_data.array[0] = 0.0;
  local_1f8.m_qr.super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>.m_storage.m_data.array
  [0] = (double)local_278;
  pCVar2 = Eigen::CommaInitializer<Eigen::Block<Eigen::Matrix<double,_4,_4,_0,_4,_4>,_1,_4,_false>_>
           ::operator_((CommaInitializer<Eigen::Block<Eigen::Matrix<double,_4,_4,_0,_4,_4>,_1,_4,_false>_>
                        *)&local_1f8,(Scalar *)&b);
  x.super_PlainObjectBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>_>.m_storage.m_data.array[0] = 0.0;
  pCVar2 = Eigen::CommaInitializer<Eigen::Block<Eigen::Matrix<double,_4,_4,_0,_4,_4>,_1,_4,_false>_>
           ::operator_(pCVar2,(Scalar *)&x);
  local_280 = 1.0;
  Eigen::CommaInitializer<Eigen::Block<Eigen::Matrix<double,_4,_4,_0,_4,_4>,_1,_4,_false>_>::
  operator_(pCVar2,&local_280);
  Eigen::CommaInitializer<Eigen::Block<Eigen::Matrix<double,_4,_4,_0,_4,_4>,_1,_4,_false>_>::
  finished((CommaInitializer<Eigen::Block<Eigen::Matrix<double,_4,_4,_0,_4,_4>,_1,_4,_false>_> *)
           &local_1f8);
  local_1f8.m_qr.super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>.m_storage.m_data.array
  [1] = 0.0;
  local_1f8.m_qr.super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>.m_storage.m_data.array
  [2] = 4.94065645841247e-324;
  local_1f8.m_qr.super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>.m_storage.m_data.array
  [3] = 4.94065645841247e-324;
  b.super_PlainObjectBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>_>.m_storage.m_data.array[0] = 0.0;
  auVar1._8_8_ = 0;
  auVar1._0_8_ = local_278._8_8_;
  local_278._0_16_ = auVar1 << 0x40;
  local_1f8.m_qr.super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>.m_storage.m_data.array
  [0] = (double)&b;
  pCVar3 = Eigen::CommaInitializer<Eigen::Matrix<double,_4,_1,_0,_4,_1>_>::operator_
                     ((CommaInitializer<Eigen::Matrix<double,_4,_1,_0,_4,_1>_> *)&local_1f8,
                      (Scalar *)local_278);
  local_280 = 0.0;
  pCVar3 = Eigen::CommaInitializer<Eigen::Matrix<double,_4,_1,_0,_4,_1>_>::operator_
                     (pCVar3,&local_280);
  local_220 = 1.0;
  Eigen::CommaInitializer<Eigen::Matrix<double,_4,_1,_0,_4,_1>_>::operator_(pCVar3,&local_220);
  Eigen::CommaInitializer<Eigen::Matrix<double,_4,_1,_0,_4,_1>_>::~CommaInitializer
            ((CommaInitializer<Eigen::Matrix<double,_4,_1,_0,_4,_1>_> *)&local_1f8);
  Eigen::ColPivHouseholderQR<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>::ColPivHouseholderQR
            (&local_1f8,&E1);
  local_278._0_16_ =
       (undefined1  [16])
       Eigen::ColPivHouseholderQR<Eigen::Matrix<double,4,4,0,4,4>>::
       solve<Eigen::Matrix<double,4,1,0,4,1>>
                 ((ColPivHouseholderQR<Eigen::Matrix<double,4,4,0,4,4>> *)&local_1f8,
                  (MatrixBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>_> *)&b);
  Eigen::internal::
  solve_retval<Eigen::ColPivHouseholderQR<Eigen::Matrix<double,4,4,0,4,4>>,Eigen::Matrix<double,4,1,0,4,1>>
  ::evalTo<Eigen::Matrix<double,4,1,0,4,1>>
            ((solve_retval<Eigen::ColPivHouseholderQR<Eigen::Matrix<double,4,4,0,4,4>>,Eigen::Matrix<double,4,1,0,4,1>>
              *)local_278,&x);
  local_278._8_8_ = &x;
  local_278._0_8_ = &E1;
  Eigen::PlainObjectBase<Eigen::Matrix<double,4,1,0,4,1>>::
  lazyAssign<Eigen::CoeffBasedProduct<Eigen::Matrix<double,4,4,0,4,4>const&,Eigen::Matrix<double,4,1,0,4,1>const&,6>>
            ((PlainObjectBase<Eigen::Matrix<double,4,1,0,4,1>> *)&local_1f8,
             (DenseBase<Eigen::CoeffBasedProduct<const_Eigen::Matrix<double,_4,_4,_0,_4,_4>_&,_const_Eigen::Matrix<double,_4,_1,_0,_4,_1>_&,_6>_>
              *)local_278);
  local_1f8.m_qr.super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>.m_storage.m_data.array
  [4] = (double)&b;
  RVar4 = Eigen::
          MatrixBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<double>,_const_Eigen::CoeffBasedProduct<const_Eigen::Matrix<double,_4,_4,_0,_4,_4>_&,_const_Eigen::Matrix<double,_4,_1,_0,_4,_1>_&,_6>,_const_Eigen::Matrix<double,_4,_1,_0,_4,_1>_>_>
          ::norm((MatrixBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<double>,_const_Eigen::CoeffBasedProduct<const_Eigen::Matrix<double,_4,_4,_0,_4,_4>_&,_const_Eigen::Matrix<double,_4,_1,_0,_4,_1>_&,_6>,_const_Eigen::Matrix<double,_4,_1,_0,_4,_1>_>_>
                  *)&local_1f8);
  (result->super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>).m_storage.m_data.array[0] =
       x.super_PlainObjectBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>_>.m_storage.m_data.array[0];
  (result->super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>).m_storage.m_data.array[1] =
       x.super_PlainObjectBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>_>.m_storage.m_data.array[1];
  (result->super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>).m_storage.m_data.array[2] =
       x.super_PlainObjectBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>_>.m_storage.m_data.array[2];
  return RVar4 / SQRT(b.super_PlainObjectBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>_>.m_storage.
                      m_data.array[3] *
                      b.super_PlainObjectBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>_>.m_storage.
                      m_data.array[3] +
                      b.super_PlainObjectBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>_>.m_storage.
                      m_data.array[1] *
                      b.super_PlainObjectBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>_>.m_storage.
                      m_data.array[1] +
                      b.super_PlainObjectBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>_>.m_storage.
                      m_data.array[2] *
                      b.super_PlainObjectBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>_>.m_storage.
                      m_data.array[2] +
                      b.super_PlainObjectBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>_>.m_storage.
                      m_data.array[0] *
                      b.super_PlainObjectBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>_>.m_storage.
                      m_data.array[0]) < 1e-06;
}

Assistant:

bool VCIQuad::solveQuadMetric(const Matrix4d& E, Vector3d& result) {
	Matrix4d E1;
	E1.row(0) = E.row(0);
	E1.row(1) << E(0, 1), E(1, 1), E(1, 2), E(1, 3);
	E1.row(2) << E(0, 2), E(1, 2), E(2, 2), E(2, 3);
	E1.row(3) << 0, 0, 0, 1;
	Vector4d b, x;
	b << 0, 0, 0, 1;
	x = E1.colPivHouseholderQr().solve(b);
	double relative_error = (E1 * x - b).norm() / b.norm();
	result(0) = x(0);
	result(1) = x(1);
	result(2) = x(2);
	return relative_error < 1e-6;
}